

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_bloomshader.cpp
# Opt level: O0

void __thiscall FBloomCombineShader::Bind(FBloomCombineShader *this)

{
  bool bVar1;
  GLuint hShader;
  FBloomCombineShader *this_local;
  
  bVar1 = FShaderProgram::operator_cast_to_bool(&this->mShader);
  if (!bVar1) {
    FShaderProgram::Compile(&this->mShader,Vertex,"shaders/glsl/screenquad.vp","",0x14a);
    FShaderProgram::Compile(&this->mShader,Fragment,"shaders/glsl/bloomcombine.fp","",0x14a);
    FShaderProgram::SetFragDataLocation(&this->mShader,0,"FragColor");
    FShaderProgram::Link(&this->mShader,"shaders/glsl/bloomcombine");
    FShaderProgram::SetAttribLocation(&this->mShader,0,"PositionInProjection");
    hShader = FShaderProgram::operator_cast_to_unsigned_int(&this->mShader);
    FBufferedUniformSampler::Init(&this->BloomTexture,hShader,"Bloom");
  }
  FShaderProgram::Bind(&this->mShader);
  return;
}

Assistant:

void FBloomCombineShader::Bind()
{
	if (!mShader)
	{
		mShader.Compile(FShaderProgram::Vertex, "shaders/glsl/screenquad.vp", "", 330);
		mShader.Compile(FShaderProgram::Fragment, "shaders/glsl/bloomcombine.fp", "", 330);
		mShader.SetFragDataLocation(0, "FragColor");
		mShader.Link("shaders/glsl/bloomcombine");
		mShader.SetAttribLocation(0, "PositionInProjection");
		BloomTexture.Init(mShader, "Bloom");
	}
	mShader.Bind();
}